

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chull.cpp
# Opt level: O1

void masc::polygon::hull2d
               (ply_vertex *s,ply_vertex *e,
               list<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_> *hull
               )

{
  size_t *psVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  _List_node_base *p_Var5;
  undefined4 extraout_var_00;
  _List_node_base *p_Var6;
  ply_vertex *v;
  undefined4 extraout_var_01;
  
  iVar3 = (*e->_vptr_ply_vertex[3])(e);
  p_Var5 = (_List_node_base *)operator_new(0x18);
  p_Var5[1]._M_next = (_List_node_base *)s;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  psVar1 = &(hull->
            super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  iVar4 = (*s->_vptr_ply_vertex[3])(s);
  p_Var5 = (_List_node_base *)operator_new(0x18);
  p_Var5[1]._M_next = (_List_node_base *)CONCAT44(extraout_var_00,iVar4);
  std::__detail::_List_node_base::_M_hook(p_Var5);
  psVar1 = &(hull->
            super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var5 = (hull->
           super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
           )._M_impl._M_node.super__List_node_base._M_prev;
  p_Var6 = (_List_node_base *)operator_new(0x18);
  p_Var6[1]._M_next = p_Var5[1]._M_next;
  std::__detail::_List_node_base::_M_hook(p_Var6);
  psVar1 = &(hull->
            super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  v = (ply_vertex *)
      (*(code *)((hull->
                 super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
                 )._M_impl._M_node.super__List_node_base._M_prev[1]._M_next)->_M_next[1]._M_prev)();
  while (v != (ply_vertex *)CONCAT44(extraout_var,iVar3)) {
    bVar2 = inHull(v,hull);
    if (!bVar2) {
      updateHullTop(v,hull);
      updateHullBot(v,hull);
      p_Var5 = (_List_node_base *)operator_new(0x18);
      p_Var5[1]._M_next = (_List_node_base *)v;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar1 = &(hull->
                super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
                )._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      p_Var5 = (_List_node_base *)operator_new(0x18);
      p_Var5[1]._M_next = (_List_node_base *)v;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar1 = &(hull->
                super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
                )._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    iVar4 = (*v->_vptr_ply_vertex[3])(v);
    v = (ply_vertex *)CONCAT44(extraout_var_01,iVar4);
  }
  p_Var5 = (hull->
           super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
           )._M_impl._M_node.super__List_node_base._M_prev;
  psVar1 = &(hull->
            super__List_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var5);
  return;
}

Assistant:

void hull2d(ply_vertex * s, ply_vertex * e, list<ply_vertex*>& hull )
{
    //avoid letting s and e in the bridge
    //if( s->getBridge()!=NULL ) s=s->getBridge()->v2;
    //if( e->getBridge()!=NULL ) e=e->getBridge()->v1;
    ply_vertex * ne=next(e);

    //init the hull
    hull.push_back(s);
    hull.push_back(next(s));
    hull.push_front(hull.back());

    //incrementally create the hull
    ply_vertex * ptr=next(hull.back());
    while(ptr!=ne){

        //check if the ptr is contained in the hull
        if( !inHull(ptr,hull) ){
            updateHullTop(ptr,hull);
            updateHullBot(ptr,hull);
            hull.push_back(ptr);
            hull.push_front(ptr);
        }

        ptr=next(ptr);

    }//end while(ptr!=ne);
    
    hull.pop_back();
}